

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_lookup_in_ipv4_t.c
# Opt level: O0

void run_tests(int mode,char *mode_desc)

{
  char *pcVar1;
  MMDB_lookup_result_s local_b8;
  addrinfo *local_98;
  addrinfo *addresses;
  addrinfo hints;
  int local_40;
  int local_3c;
  int mmdb_error;
  int gai_error;
  char *ip;
  MMDB_s *mmdb;
  char *path;
  char *filename;
  char *mode_desc_local;
  int mode_local;
  
  path = "MaxMind-DB-test-ipv4-28.mmdb";
  filename = mode_desc;
  mode_desc_local._4_4_ = mode;
  mmdb = (MMDB_s *)test_database_path("MaxMind-DB-test-ipv4-28.mmdb");
  ip = (char *)open_ok((char *)mmdb,mode_desc_local._4_4_,filename);
  free(mmdb);
  _mmdb_error = "::abcd";
  MMDB_lookup_string((MMDB_lookup_result_s *)&hints.ai_next,(MMDB_s *)ip,"::abcd",&local_3c,
                     &local_40);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/ipv6_lookup_in_ipv4_t.c"
                ,0x12,local_40,"==",0xb,
                "MMDB_lookup_string sets mmdb_error to MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an IPv6 address in an IPv4-only database"
                ,0);
  memset(&addresses,0,0x30);
  addresses._0_4_ = 4;
  addresses._4_4_ = 10;
  local_3c = getaddrinfo("2001:db8:85a3:0:0:8a2e:370:7334",(char *)0x0,(addrinfo *)&addresses,
                         &local_98);
  if (local_3c != 0) {
    pcVar1 = gai_strerror(local_3c);
    bail_out(0,"getaddrinfo failed: %s",pcVar1,0);
  }
  local_40 = 0;
  MMDB_lookup_sockaddr(&local_b8,(MMDB_s *)ip,(sockaddr *)local_98->ai_addr,&local_40);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/ipv6_lookup_in_ipv4_t.c"
                ,0x25,local_40,"==",0xb,
                "MMDB_lookup_sockaddr sets mmdb_error to MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an IPv6 address in an IPv4-only database"
                ,0);
  freeaddrinfo(local_98);
  MMDB_close((MMDB_s *)ip);
  free(ip);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-test-ipv4-28.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    const char *ip = "::abcd";
    int gai_error, mmdb_error;
    MMDB_lookup_string(mmdb, ip, &gai_error, &mmdb_error);

    cmp_ok(mmdb_error,
           "==",
           MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR,
           "MMDB_lookup_string sets mmdb_error to "
           "MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an "
           "IPv6 address in an IPv4-only database");

    struct addrinfo hints = {.ai_family = AF_INET6, .ai_flags = AI_NUMERICHOST};

    struct addrinfo *addresses;
    gai_error = getaddrinfo(
        "2001:db8:85a3:0:0:8a2e:370:7334", NULL, &hints, &addresses);
    if (gai_error) {
        BAIL_OUT("getaddrinfo failed: %s", gai_strerror(gai_error));
    }

    mmdb_error = 0;
    MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, &mmdb_error);

    cmp_ok(mmdb_error,
           "==",
           MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR,
           "MMDB_lookup_sockaddr sets mmdb_error to "
           "MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an "
           "IPv6 address in an IPv4-only database");

    freeaddrinfo(addresses);
    MMDB_close(mmdb);
    free(mmdb);
}